

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

lua_Number lua_tonumberx(lua_State *L,int idx,int *ok)

{
  int iVar1;
  TValue *pTVar2;
  TValue tmp;
  TValue local_10;
  
  pTVar2 = index2adr(L,idx);
  if ((pTVar2->field_2).it < 0xffff0000) {
    if (ok != (int *)0x0) {
      *ok = 1;
    }
    local_10.u32 = (anon_struct_8_2_f9ee98fb_for_u32)pTVar2->u64;
  }
  else if (((pTVar2->field_2).it == 0xfffffffb) &&
          (iVar1 = lj_strscan_num((GCstr *)(ulong)(pTVar2->u32).lo,&local_10), iVar1 != 0)) {
    if (ok != (int *)0x0) {
      *ok = 1;
    }
  }
  else {
    local_10.u64 = 0;
    if (ok != (int *)0x0) {
      *ok = 0;
    }
  }
  return (lua_Number)local_10.u64;
}

Assistant:

LUA_API lua_Number lua_tonumberx(lua_State *L, int idx, int *ok)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  if (LJ_LIKELY(tvisnumber(o))) {
    if (ok) *ok = 1;
    return numberVnum(o);
  } else if (tvisstr(o) && lj_strscan_num(strV(o), &tmp)) {
    if (ok) *ok = 1;
    return numV(&tmp);
  } else {
    if (ok) *ok = 0;
    return 0;
  }
}